

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::OutputHelper<google::protobuf::internal::ArrayOutput,_4>::Serialize
               (void *ptr,ArrayOutput *output)

{
  uint8 *puVar1;
  
  puVar1 = PrimitiveTypeHelper<4>::SerializeToArray(ptr,output->ptr);
  output->ptr = puVar1;
  return;
}

Assistant:

static void Serialize(const void* ptr, ArrayOutput* output) {
    output->ptr = PrimitiveTypeHelper<type>::SerializeToArray(ptr, output->ptr);
  }